

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

_Bool tcg_out_mov(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,TCGReg arg)

{
  byte *pbVar1;
  undefined1 in_AL;
  byte bVar2;
  TCGType_conflict opc;
  int in_R9D;
  
  if (arg == ret) {
    return (_Bool)in_AL;
  }
  switch(type) {
  case TCG_TYPE_I32:
    goto switchD_00d04684_caseD_0;
  case TCG_TYPE_I64:
    type = 0x1000;
switchD_00d04684_caseD_0:
    if (TCG_REG_R15 < ret) {
      if (arg < TCG_REG_XMM0) {
        opc = type | 0x56e;
      }
      else {
switchD_00d04684_caseD_2:
        opc = 0x2017e;
      }
      break;
    }
    if (TCG_REG_R15 < arg) {
      tcg_out_vex_opc(s,type | 0x57e,arg,0,ret,in_R9D);
      bVar2 = ((byte)ret & 7) + (byte)arg * '\b';
      goto LAB_00d046f2;
    }
    tcg_out_opc(s,type | 0x8b,ret,arg,0);
    goto LAB_00d046ea;
  case TCG_TYPE_V64:
    goto switchD_00d04684_caseD_2;
  case TCG_TYPE_V128:
    opc = 0x56f;
    break;
  case TCG_TYPE_V256:
    opc = 0x8056f;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x36e,(char *)0x0);
  }
  tcg_out_vex_opc(s,opc,ret,0,arg,in_R9D);
LAB_00d046ea:
  bVar2 = ((byte)arg & 7) + (byte)ret * '\b';
LAB_00d046f2:
  pbVar1 = s->code_ptr;
  s->code_ptr = pbVar1 + 1;
  *pbVar1 = bVar2 | 0xc0;
  return (_Bool)(bVar2 | 0xc0);
}

Assistant:

static bool tcg_out_mov(TCGContext *s, TCGType type, TCGReg ret, TCGReg arg)
{
    int rexw = 0;

    if (arg == ret) {
        return true;
    }
    switch (type) {
    case TCG_TYPE_I64:
        rexw = P_REXW;
        /* fallthru */
    case TCG_TYPE_I32:
        if (ret < 16) {
            if (arg < 16) {
                tcg_out_modrm(s, OPC_MOVL_GvEv + rexw, ret, arg);
            } else {
                tcg_out_vex_modrm(s, OPC_MOVD_EyVy + rexw, arg, 0, ret);
            }
        } else {
            if (arg < 16) {
                tcg_out_vex_modrm(s, OPC_MOVD_VyEy + rexw, ret, 0, arg);
            } else {
                tcg_out_vex_modrm(s, OPC_MOVQ_VqWq, ret, 0, arg);
            }
        }
        break;

    case TCG_TYPE_V64:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVQ_VqWq, ret, 0, arg);
        break;
    case TCG_TYPE_V128:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVDQA_VxWx, ret, 0, arg);
        break;
    case TCG_TYPE_V256:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVDQA_VxWx | P_VEXL, ret, 0, arg);
        break;

    default:
        g_assert_not_reached();
    }
    return true;
}